

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O0

void banksia::TourMng::append2TextFile(string *path,string *str)

{
  _Ios_Openmode _Var1;
  ostream *this;
  string *in_RSI;
  string *in_RDI;
  ofstream ofs;
  ostream local_210 [512];
  string *local_10;
  
  local_10 = in_RSI;
  _Var1 = std::operator|(_S_out,_S_app);
  std::ofstream::ofstream(local_210,in_RDI,_Var1);
  this = std::operator<<(local_210,local_10);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void TourMng::append2TextFile(const std::string& path, const std::string& str)
{
    std::ofstream ofs(path, std::ios_base::out | std::ios_base::app);
    ofs << str << std::endl;
    ofs.close();
}